

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O1

void __thiscall SchnorrPubkey_FromPubkey_Test::TestBody(SchnorrPubkey_FromPubkey_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  bool bVar4;
  char *pcVar5;
  char *in_R9;
  bool parity [4];
  bool is_parity;
  Pubkey pk_aa1;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_6;
  string exp_pk_a;
  string exp_pk_b;
  string exp_pk_c2;
  SchnorrPubkey spk_a1;
  Pubkey pk_a1;
  SchnorrPubkey spk_b2;
  SchnorrPubkey spk_b1;
  SchnorrPubkey spk_a2;
  Pubkey pk_b2;
  Pubkey pk_b1;
  Pubkey pk_a2;
  SchnorrPubkey actual_pubkey;
  string exp_pk_c2p;
  bool local_1fc;
  internal local_1fb;
  bool local_1fa;
  internal local_1f9;
  string local_1f8;
  bool local_1d1;
  Pubkey local_1d0;
  undefined1 local_1b8 [8];
  undefined8 *local_1b0;
  internal local_1a8 [16];
  AssertHelper local_198;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_190;
  string local_188;
  string local_168;
  AssertHelper local_148;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_140;
  undefined1 local_138 [16];
  SchnorrPubkey local_128;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_110;
  SchnorrPubkey local_f8;
  SchnorrPubkey local_e0;
  SchnorrPubkey local_c8;
  Pubkey local_b0;
  Pubkey local_98;
  Pubkey local_80;
  SchnorrPubkey local_68;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_1d1 = false;
  cfd::core::Privkey::GetPubkey((Pubkey *)&local_188,&::sk);
  cfd::core::SchnorrPubkey::FromPubkey(&local_68,(Pubkey *)&local_188,&local_1d1);
  if ((long *)local_188._M_dataplus._M_p != (long *)0x0) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_188,&::pubkey);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_168,&local_68);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_148,"pubkey.GetHex()","actual_pubkey.GetHex()",&local_188,&local_168
            );
  paVar2 = &local_168.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  paVar3 = &local_188.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_148.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_188);
    if (local_140.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_140.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_168,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x67,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_168,(Message *)&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_168);
    if ((long *)local_188._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_188._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_188._M_dataplus._M_p + 8))();
      }
      local_188._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_140,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_188,"pubkey_parity","is_parity",&pubkey_parity,&local_1d1);
  if ((char)local_188._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_168);
    if ((undefined8 *)local_188._M_string_length == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_188._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x68,pcVar5);
    testing::internal::AssertHelper::operator=(&local_148,(Message *)&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_148);
    if ((long *)local_168._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_168._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_168._M_dataplus._M_p + 8))();
      }
      local_168._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_188._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_188._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d","");
  cfd::core::Pubkey::Pubkey((Pubkey *)&local_110,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d","");
  cfd::core::Pubkey::Pubkey(&local_80,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54","");
  cfd::core::Pubkey::Pubkey(&local_98,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,
             "03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54","");
  cfd::core::Pubkey::Pubkey(&local_b0,&local_188);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  local_188._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_188,"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d"
             ,"");
  local_168._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54"
             ,"");
  local_148.data_ = (AssertHelperData *)local_138;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,
             "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_50,"02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124"
             ,"");
  cfd::core::SchnorrPubkey::FromPubkey(&local_128,(Pubkey *)&local_110,&local_1fc);
  cfd::core::SchnorrPubkey::FromPubkey(&local_c8,&local_80,(bool *)&local_1fb);
  cfd::core::SchnorrPubkey::FromPubkey(&local_e0,&local_98,&local_1fa);
  cfd::core::SchnorrPubkey::FromPubkey(&local_f8,&local_b0,(bool *)&local_1f9);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1f8,&local_128);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_1b8,"exp_pk_a","spk_a1.GetHex()",&local_188,&local_1f8);
  paVar1 = &local_1f8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x79,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((long *)local_1f8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_1f8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1f8._M_dataplus._M_p + 8))();
      }
      local_1f8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8[0] = (internal)(local_1fc ^ 1);
  local_1b0 = (undefined8 *)0x0;
  if (local_1fc != false) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_1b8,(AssertionResult *)"parity[0]","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7a,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((long *)local_1d0.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)local_1d0.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_1d0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1f8,&local_c8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_1b8,"exp_pk_a","spk_a2.GetHex()",&local_188,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7b,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((long *)local_1f8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_1f8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1f8._M_dataplus._M_p + 8))();
      }
      local_1f8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8[0] = local_1fb;
  local_1b0 = (undefined8 *)0x0;
  if (local_1fb == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_1b8,(AssertionResult *)"parity[1]","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7c,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((long *)local_1d0.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)local_1d0.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_1d0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1f8,&local_e0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_1b8,"exp_pk_b","spk_b1.GetHex()",&local_168,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7d,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((long *)local_1f8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_1f8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1f8._M_dataplus._M_p + 8))();
      }
      local_1f8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8[0] = (internal)(local_1fa ^ 1);
  local_1b0 = (undefined8 *)0x0;
  if (local_1fa != false) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_1b8,(AssertionResult *)"parity[2]","true","false",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7e,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((long *)local_1d0.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)local_1d0.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_1d0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_(&local_1f8,&local_f8);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)local_1b8,"exp_pk_b","spk_b2.GetHex()",&local_168,&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if (local_1b0 == (undefined8 *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (char *)*local_1b0;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x7f,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d0,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d0);
    if ((long *)local_1f8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_1f8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1f8._M_dataplus._M_p + 8))();
      }
      local_1f8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_1b8[0] = local_1f9;
  local_1b0 = (undefined8 *)0x0;
  if (local_1f9 == (internal)0x0) {
    testing::Message::Message((Message *)&local_1d0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1f8,(internal *)local_1b8,(AssertionResult *)"parity[3]","false","true",in_R9)
    ;
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x80,local_1f8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_198,(Message *)&local_1d0);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    if ((long *)local_1d0.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) &&
         ((long *)local_1d0.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (long *)0x0)) {
        (**(code **)(*(long *)local_1d0.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start + 8))();
      }
      local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  cfd::core::SchnorrPubkey::CreatePubkey(&local_1d0,&local_128,local_1fc);
  cfd::core::Pubkey::GetHex_abi_cxx11_(&local_1f8,(Pubkey *)&local_110);
  cfd::core::Pubkey::GetHex_abi_cxx11_((string *)local_1b8,&local_1d0);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&local_198,"pk_a1.GetHex()","pk_aa1.GetHex()",&local_1f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b8);
  if ((internal *)CONCAT71(local_1b8._1_7_,local_1b8[0]) != local_1a8) {
    operator_delete((void *)CONCAT71(local_1b8._1_7_,local_1b8[0]));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8._M_dataplus._M_p);
  }
  if (local_198.data_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_1f8);
    if (local_190.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((local_190.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_1b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_schnorrsig.cpp"
               ,0x83,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_1b8,(Message *)&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_1b8);
    if ((long *)local_1f8._M_dataplus._M_p != (long *)0x0) {
      bVar4 = testing::internal::IsTrue(true);
      if ((bVar4) && ((long *)local_1f8._M_dataplus._M_p != (long *)0x0)) {
        (**(code **)(*(long *)local_1f8._M_dataplus._M_p + 8))();
      }
      local_1f8._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_190,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if ((long *)local_1d0.data_.data_.
              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start != (long *)0x0) {
    operator_delete(local_1d0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_f8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_e0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_c8.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_c8.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_128.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_128.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_148.data_ != (AssertHelperData *)local_138) {
    operator_delete(local_148.data_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != paVar2) {
    operator_delete(local_168._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != paVar3) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_b0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b0.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_98.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_80.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((void *)local_110._M_allocated_capacity != (void *)0x0) {
    operator_delete((void *)local_110._M_allocated_capacity);
  }
  if (local_68.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(SchnorrPubkey, FromPubkey) {
  bool is_parity = false;
  auto actual_pubkey = SchnorrPubkey::FromPubkey(sk.GetPubkey(), &is_parity);
  EXPECT_EQ(pubkey.GetHex(), actual_pubkey.GetHex());
  EXPECT_EQ(pubkey_parity, is_parity);

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_a = "4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d";
  std::string exp_pk_b = "dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  bool parity[4];
  auto spk_a1 = SchnorrPubkey::FromPubkey(pk_a1, &parity[0]);
  auto spk_a2 = SchnorrPubkey::FromPubkey(pk_a2, &parity[1]);
  auto spk_b1 = SchnorrPubkey::FromPubkey(pk_b1, &parity[2]);
  auto spk_b2 = SchnorrPubkey::FromPubkey(pk_b2, &parity[3]);

  EXPECT_EQ(exp_pk_a, spk_a1.GetHex());
  EXPECT_FALSE(parity[0]);
  EXPECT_EQ(exp_pk_a, spk_a2.GetHex());
  EXPECT_TRUE(parity[1]);
  EXPECT_EQ(exp_pk_b, spk_b1.GetHex());
  EXPECT_FALSE(parity[2]);
  EXPECT_EQ(exp_pk_b, spk_b2.GetHex());
  EXPECT_TRUE(parity[3]);

  Pubkey pk_aa1 = spk_a1.CreatePubkey(parity[0]);
  EXPECT_EQ(pk_a1.GetHex(), pk_aa1.GetHex());

}